

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_parse_hex(char *p,int length)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    bVar1 = p[lVar3];
    if ((byte)(bVar1 + 0x9f) < 6) {
      iVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar4 = bVar1 - 0x37;
    }
    else {
      iVar4 = (char)bVar1 + -0x30;
    }
    iVar2 = iVar2 * 0x10 + iVar4;
  }
  return iVar2;
}

Assistant:

NK_INTERN int
nk_parse_hex(const char *p, int length)
{
int i = 0;
int len = 0;
while (len < length) {
i <<= 4;
if (p[len] >= 'a' && p[len] <= 'f')
i += ((p[len] - 'a') + 10);
else if (p[len] >= 'A' && p[len] <= 'F')
i += ((p[len] - 'A') + 10);
else i += (p[len] - '0');
len++;
}
return i;
}